

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

cmNinjaTargetGenerator * cmNinjaTargetGenerator::New(cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmNinjaNormalTargetGenerator *this;
  
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 < UTILITY) {
    this = (cmNinjaNormalTargetGenerator *)operator_new(0x260);
    cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(this,target);
  }
  else if (TVar1 - UTILITY < 2) {
    this = (cmNinjaNormalTargetGenerator *)operator_new(0x180);
    cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
              ((cmNinjaUtilityTargetGenerator *)this,target);
  }
  else {
    this = (cmNinjaNormalTargetGenerator *)0x0;
  }
  return &this->super_cmNinjaTargetGenerator;
}

Assistant:

cmNinjaTargetGenerator* cmNinjaTargetGenerator::New(cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return new cmNinjaNormalTargetGenerator(target);

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
      return new cmNinjaUtilityTargetGenerator(target);

    default:
      return CM_NULLPTR;
  }
}